

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# word_split.hpp
# Opt level: O1

pair<std::vector<char32_t,_std::allocator<char32_t>_>,_std::vector<char32_t,_std::allocator<char32_t>_>_>
* __thiscall
jessilib::
word_split_once<std::vector<char32_t,std::allocator<char32_t>>,__gnu_cxx::__normal_iterator<char32_t_const*,std::vector<char32_t,std::allocator<char32_t>>>,__gnu_cxx::__normal_iterator<char32_t_const*,std::vector<char32_t,std::allocator<char32_t>>>,char32_t>
          (pair<std::vector<char32_t,_std::allocator<char32_t>_>,_std::vector<char32_t,_std::allocator<char32_t>_>_>
           *__return_storage_ptr__,jessilib *this,
          __normal_iterator<const_char32_t_*,_std::vector<char32_t,_std::allocator<char32_t>_>_>
          begin,__normal_iterator<const_char32_t_*,_std::vector<char32_t,_std::allocator<char32_t>_>_>
                end,char32_t in_whitespace)

{
  char32_t cVar1;
  __normal_iterator<const_char32_t_*,_std::vector<char32_t,_std::allocator<char32_t>_>_> __first;
  pointer pcVar2;
  pointer pcVar3;
  allocator_type local_79;
  pointer local_78;
  pointer pcStack_70;
  pointer pcStack_68;
  pointer local_58;
  pointer pcStack_50;
  pointer local_48;
  pointer pcStack_40;
  pointer local_38;
  pointer pcStack_30;
  
  local_38 = (pointer)0x0;
  pcStack_30 = (pointer)0x0;
  local_48 = (pointer)0x0;
  pcStack_40 = (pointer)0x0;
  local_58 = (pointer)0x0;
  pcStack_50 = (pointer)0x0;
  if (this < begin._M_current) {
    do {
      cVar1 = (char32_t)end._M_current;
      __first._M_current = (char32_t *)this;
      if (*(char32_t *)this != cVar1) break;
      this = this + 4;
      __first._M_current = (char32_t *)this;
    } while (this != (jessilib *)begin._M_current);
    do {
      if (this == (jessilib *)begin._M_current) goto LAB_00406db2;
      if (*(char32_t *)this == cVar1) {
        std::vector<char32_t,std::allocator<char32_t>>::
        vector<__gnu_cxx::__normal_iterator<char32_t_const*,std::vector<char32_t,std::allocator<char32_t>>>,void>
                  ((vector<char32_t,std::allocator<char32_t>> *)&local_78,__first,
                   (__normal_iterator<const_char32_t_*,_std::vector<char32_t,_std::allocator<char32_t>_>_>
                    )this,&local_79);
        pcVar2 = local_48;
        pcVar3 = local_58;
        local_58 = local_78;
        pcStack_50 = pcStack_70;
        local_48 = pcStack_68;
        local_78 = (pointer)0x0;
        pcStack_70 = (pointer)0x0;
        pcStack_68 = (pointer)0x0;
        if (pcVar3 != (pointer)0x0) {
          operator_delete(pcVar3,(long)pcVar2 - (long)pcVar3);
        }
        if (local_78 != (pointer)0x0) {
          operator_delete(local_78,(long)pcStack_68 - (long)local_78);
        }
        goto LAB_00406e71;
      }
      this = (jessilib *)((long)this + 4);
    } while( true );
  }
  (__return_storage_ptr__->first).super__Vector_base<char32_t,_std::allocator<char32_t>_>._M_impl.
  super__Vector_impl_data._M_start = (pointer)0x0;
  (__return_storage_ptr__->first).super__Vector_base<char32_t,_std::allocator<char32_t>_>._M_impl.
  super__Vector_impl_data._M_finish = (pointer)0x0;
  (__return_storage_ptr__->first).super__Vector_base<char32_t,_std::allocator<char32_t>_>._M_impl.
  super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  goto LAB_00406f05;
LAB_00406db2:
  std::vector<char32_t,std::allocator<char32_t>>::
  vector<__gnu_cxx::__normal_iterator<char32_t_const*,std::vector<char32_t,std::allocator<char32_t>>>,void>
            ((vector<char32_t,std::allocator<char32_t>> *)&local_78,__first,begin,&local_79);
  pcVar2 = local_48;
  pcVar3 = local_58;
  local_58 = local_78;
  pcStack_50 = pcStack_70;
  local_48 = pcStack_68;
  goto LAB_00406eb1;
  while (*(char32_t *)this == cVar1) {
LAB_00406e71:
    this = (jessilib *)((long)this + 4);
    if (this == (jessilib *)begin._M_current) break;
  }
  std::vector<char32_t,std::allocator<char32_t>>::
  vector<__gnu_cxx::__normal_iterator<char32_t_const*,std::vector<char32_t,std::allocator<char32_t>>>,void>
            ((vector<char32_t,std::allocator<char32_t>> *)&local_78,
             (__normal_iterator<const_char32_t_*,_std::vector<char32_t,_std::allocator<char32_t>_>_>
             )this,begin,&local_79);
  pcVar2 = pcStack_30;
  pcVar3 = pcStack_40;
  pcStack_40 = local_78;
  local_38 = pcStack_70;
  pcStack_30 = pcStack_68;
LAB_00406eb1:
  local_78 = (pointer)0x0;
  pcStack_70 = (pointer)0x0;
  pcStack_68 = (pointer)0x0;
  if (pcVar3 != (pointer)0x0) {
    operator_delete(pcVar3,(long)pcVar2 - (long)pcVar3);
  }
  if (local_78 != (pointer)0x0) {
    operator_delete(local_78,(long)pcStack_68 - (long)local_78);
  }
  (__return_storage_ptr__->first).super__Vector_base<char32_t,_std::allocator<char32_t>_>._M_impl.
  super__Vector_impl_data._M_start = local_58;
  (__return_storage_ptr__->first).super__Vector_base<char32_t,_std::allocator<char32_t>_>._M_impl.
  super__Vector_impl_data._M_finish = pcStack_50;
  (__return_storage_ptr__->first).super__Vector_base<char32_t,_std::allocator<char32_t>_>._M_impl.
  super__Vector_impl_data._M_end_of_storage = local_48;
LAB_00406f05:
  (__return_storage_ptr__->second).super__Vector_base<char32_t,_std::allocator<char32_t>_>._M_impl.
  super__Vector_impl_data._M_start = pcStack_40;
  (__return_storage_ptr__->second).super__Vector_base<char32_t,_std::allocator<char32_t>_>._M_impl.
  super__Vector_impl_data._M_finish = local_38;
  (__return_storage_ptr__->second).super__Vector_base<char32_t,_std::allocator<char32_t>_>._M_impl.
  super__Vector_impl_data._M_end_of_storage = pcStack_30;
  return __return_storage_ptr__;
}

Assistant:

constexpr auto word_split_once(ItrT begin, EndT end, ElementT in_whitespace) {
	static_assert(sizeof...(OptionalMemberT) <= 1, "Too many member types specified for OptionalMemberT");
	using MemberT = std::tuple_element_t<0, std::tuple<OptionalMemberT..., std::basic_string<ElementT>>>;

	std::pair<MemberT, MemberT> result;
	if (begin >= end) {
		// Nothing to word_split
		return result;
	}

	while (begin != end
		&& *begin == in_whitespace) {
		++begin;
	}

	for (auto itr = begin; itr != end; ++itr) {
		if (*itr == in_whitespace) {
			// in_whitespace found; word_split upon it
			result.first = make_word_split_member<MemberT>(begin, itr);

			++itr;
			while (itr != end
				&& *itr == in_whitespace) {
				++itr;
			}

			result.second = make_word_split_member<MemberT>(itr, end);
			return result;
		}
	}

	// in_whitespace not found
	result.first = make_word_split_member<MemberT>(begin, end);
	return result;
}